

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::MergeFrom
          (CustomModel_CustomModelParamValue *this,CustomModel_CustomModelParamValue *from)

{
  uint32_t uVar1;
  ulong uVar2;
  LogMessage *other;
  undefined8 *puVar3;
  ulong uVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/CustomModel.pb.cc"
               ,0x181);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 10) {
    _internal_set_doublevalue(this,(from->value_).doublevalue_);
    goto LAB_0028e078;
  }
  if (uVar1 == 0x14) {
    uVar4 = (from->value_).longvalue_;
    if (this->_oneof_case_[0] != 0x14) {
      clear_value(this);
      this->_oneof_case_[0] = 0x14;
LAB_0028e03f:
      (this->value_).doublevalue_ =
           (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
    }
  }
  else {
    if (uVar1 == 0x1e) {
      _internal_set_intvalue(this,(from->value_).intvalue_);
      goto LAB_0028e078;
    }
    if (uVar1 == 0x28) {
      _internal_set_longvalue(this,(from->value_).longvalue_);
      goto LAB_0028e078;
    }
    if (uVar1 == 0x32) {
      _internal_set_boolvalue(this,(bool)((from->value_).boolvalue_ & 1));
      goto LAB_0028e078;
    }
    if (uVar1 != 0x3c) goto LAB_0028e078;
    uVar4 = (from->value_).longvalue_;
    if (this->_oneof_case_[0] != 0x3c) {
      clear_value(this);
      this->_oneof_case_[0] = 0x3c;
      goto LAB_0028e03f;
    }
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar3 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
  if ((uVar2 & 1) != 0) {
    puVar3 = (undefined8 *)*puVar3;
  }
  google::protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)&this->value_,uVar4 & 0xfffffffffffffffe,puVar3);
LAB_0028e078:
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CustomModel_CustomModelParamValue::MergeFrom(const CustomModel_CustomModelParamValue& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.value_case()) {
    case kDoubleValue: {
      _internal_set_doublevalue(from._internal_doublevalue());
      break;
    }
    case kStringValue: {
      _internal_set_stringvalue(from._internal_stringvalue());
      break;
    }
    case kIntValue: {
      _internal_set_intvalue(from._internal_intvalue());
      break;
    }
    case kLongValue: {
      _internal_set_longvalue(from._internal_longvalue());
      break;
    }
    case kBoolValue: {
      _internal_set_boolvalue(from._internal_boolvalue());
      break;
    }
    case kBytesValue: {
      _internal_set_bytesvalue(from._internal_bytesvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}